

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O2

int get_pred_buffer(PRED_BUFFER *p,int len)

{
  long lVar1;
  int *piVar2;
  
  piVar2 = &p->in_use;
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 3) {
      return -1;
    }
    if (*piVar2 == 0) break;
    lVar1 = lVar1 + 1;
    piVar2 = piVar2 + 4;
  }
  *piVar2 = 1;
  return (int)lVar1;
}

Assistant:

static inline int get_pred_buffer(PRED_BUFFER *p, int len) {
  for (int buf_idx = 0; buf_idx < len; buf_idx++) {
    if (!p[buf_idx].in_use) {
      p[buf_idx].in_use = 1;
      return buf_idx;
    }
  }
  return -1;
}